

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

bool __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::increase_size(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong numBuckets;
  
  sVar2 = this->mMask;
  if (sVar2 == 0) {
    initData(this,8);
  }
  else {
    numBuckets = sVar2 + 1;
    if (numBuckets < 0x28f5c28f5c28f5d) {
      uVar4 = (numBuckets * 0x50) / 100;
    }
    else {
      uVar4 = (numBuckets / 100) * 0x50;
    }
    uVar3 = this->mNumElements;
    if (uVar3 < uVar4) {
      bVar1 = try_increase_info(this);
      if (bVar1) {
        return true;
      }
      sVar2 = this->mMask;
      uVar3 = this->mNumElements;
      numBuckets = sVar2 + 1;
    }
    if (numBuckets < 0x28f5c28f5c28f5d) {
      uVar4 = (numBuckets * 0x50) / 100;
    }
    else {
      uVar4 = (numBuckets / 100) * 0x50;
    }
    bVar1 = uVar4 <= uVar3 * 2;
    if (bVar1) {
      numBuckets = sVar2 * 2 + 2;
    }
    else {
      this->mHashMultiplier = this->mHashMultiplier + 0xc4ceb9fe1a85ec54;
    }
    rehashPowerOfTwo(this,numBuckets,!bVar1);
  }
  return true;
}

Assistant:

bool increase_size() {
        // nothing allocated yet? just allocate InitialNumElements
        if (0 == mMask) {
            initData(InitialNumElements);
            return true;
        }

        auto const maxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        if (mNumElements < maxNumElementsAllowed && try_increase_info()) {
            return true;
        }

        ROBIN_HOOD_LOG("mNumElements=" << mNumElements << ", maxNumElementsAllowed="
                                       << maxNumElementsAllowed << ", load="
                                       << (static_cast<double>(mNumElements) * 100.0 /
                                           (static_cast<double>(mMask) + 1)))

        if (mNumElements * 2 < calcMaxNumElementsAllowed(mMask + 1)) {
            // we have to resize, even though there would still be plenty of space left!
            // Try to rehash instead. Delete freed memory so we don't steadyily increase mem in case
            // we have to rehash a few times
            nextHashMultiplier();
            rehashPowerOfTwo(mMask + 1, true);
        } else {
            // we've reached the capacity of the map, so the hash seems to work nice. Keep using it.
            rehashPowerOfTwo((mMask + 1) * 2, false);
        }
        return true;
    }